

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmHashEntryPLI::CVmHashEntryPLI(CVmHashEntryPLI *this,vm_obj_id_t id)

{
  undefined4 in_ESI;
  char *in_RDI;
  CVmHashEntryCS *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  CVmHashEntryCS::CVmHashEntryCS
            (unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  *(undefined ***)in_RDI = &PTR__CVmHashEntryPLI_00447c60;
  *(undefined4 *)(in_RDI + 0x24) = in_ESI;
  in_RDI[0x28] = '\0';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  return;
}

Assistant:

CVmHashEntryPLI(vm_obj_id_t id)
        : CVmHashEntryCS((char *)&id, sizeof(id), TRUE)
    {
        /* 
         *   remember our object ID for easy access (technically, it's stored
         *   as our key value as well, so this is redundant; but it's
         *   transformed into a block of bytes for the key, so it's easier to
         *   keep a separate copy of the true type) 
         */
        id_ = id;

        /* initialize our status */
        status = PLI_UNINITED;
    }